

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

int __thiscall zmq::stream_t::xsend(stream_t *this,msg_t *msg_)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  pipe_t *this_00;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  size_t in_RCX;
  void *__buf;
  blob_t *in_RSI;
  blob_t *pbVar9;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  char *errstr_5;
  int rc;
  char *errstr_4;
  int rc_3;
  bool ok;
  char *errstr_3;
  char *errstr_2;
  int rc_2;
  char *errstr_1;
  char *errstr;
  int rc_1;
  out_pipe_t *out_pipe;
  pipe_t *in_stack_ffffffffffffff50;
  msg_t *in_stack_ffffffffffffff58;
  blob_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 delay_;
  pipe_t *in_stack_ffffffffffffff90;
  blob_t local_38;
  pipe_t *local_20;
  blob_t *local_18;
  
  delay_ = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_18 = in_RSI;
  if ((*(byte *)(in_RDI + 0x800) & 1) != 0) {
    pbVar9 = (blob_t *)0x1;
    msg_t::reset_flags((msg_t *)in_RSI,'\x01');
    *(undefined1 *)(in_RDI + 0x800) = 0;
    if (*(long *)(in_RDI + 0x7f8) == 0) {
      iVar3 = msg_t::close((msg_t *)local_18,(int)pbVar9);
      if (iVar3 != 0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        pbVar9 = (blob_t *)0x258315;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
                ,0x9b);
        fflush(_stderr);
        zmq_abort((char *)0x20d111);
      }
    }
    else {
      sVar5 = msg_t::size(in_stack_ffffffffffffff58);
      if (sVar5 == 0) {
        ctx = (EVP_PKEY_CTX *)0x0;
        pipe_t::terminate(in_stack_ffffffffffffff90,(bool)delay_);
        iVar3 = msg_t::close((msg_t *)local_18,(int)ctx);
        if (iVar3 != 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          ctx = (EVP_PKEY_CTX *)0x258315;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
                  ,0x8f);
          fflush(_stderr);
          zmq_abort((char *)0x20cfba);
        }
        iVar3 = msg_t::init((msg_t *)local_18,ctx);
        if (iVar3 != 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
                  ,0x91);
          fflush(_stderr);
          zmq_abort((char *)0x20d031);
        }
        *(undefined8 *)(in_RDI + 0x7f8) = 0;
        return 0;
      }
      pbVar9 = local_18;
      uVar8 = pipe_t::write(*(pipe_t **)(in_RDI + 0x7f8),(int)local_18,__buf,in_RCX);
      if ((uVar8 & 1) != 0) {
        pipe_t::flush(in_stack_ffffffffffffff50);
      }
      *(undefined8 *)(in_RDI + 0x7f8) = 0;
    }
    iVar3 = msg_t::init((msg_t *)local_18,(EVP_PKEY_CTX *)pbVar9);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
              ,0xa0);
      fflush(_stderr);
      zmq_abort((char *)0x20d18a);
    }
    return 0;
  }
  if (*(long *)(in_RDI + 0x7f8) != 0) {
    pcVar7 = "Assertion failed: %s (%s:%d)\n";
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_current_out",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
            ,0x5c);
    fflush(_stderr);
    zmq_abort((char *)0x20ccb4);
    in_RSI = (blob_t *)pcVar7;
  }
  bVar1 = msg_t::flags((msg_t *)local_18);
  if ((bVar1 & 1) != 0) {
    pvVar4 = msg_t::data(in_stack_ffffffffffffff58);
    sVar5 = msg_t::size(in_stack_ffffffffffffff58);
    in_RSI = &local_38;
    blob_t::blob_t(in_RSI,pvVar4,sVar5);
    pbVar9 = in_RSI;
    this_00 = (pipe_t *)
              routing_socket_base_t::lookup_out_pipe
                        ((routing_socket_base_t *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68);
    blob_t::~blob_t(pbVar9);
    local_20 = this_00;
    if (this_00 == (pipe_t *)0x0) {
      piVar6 = __errno_location();
      *piVar6 = 0x71;
      return -1;
    }
    *(_func_int ***)(in_RDI + 0x7f8) = (this_00->super_object_t)._vptr_object_t;
    bVar2 = pipe_t::check_write(this_00);
    if (!bVar2) {
      *(undefined1 *)&(local_20->super_object_t)._ctx = 0;
      *(undefined8 *)(in_RDI + 0x7f8) = 0;
      piVar6 = __errno_location();
      *piVar6 = 0xb;
      return -1;
    }
  }
  *(undefined1 *)(in_RDI + 0x800) = 1;
  iVar3 = msg_t::close((msg_t *)local_18,(int)in_RSI);
  if (iVar3 != 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    in_RSI = (blob_t *)0x258315;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
            ,0x7b);
    fflush(_stderr);
    zmq_abort((char *)0x20ce66);
  }
  iVar3 = msg_t::init((msg_t *)local_18,(EVP_PKEY_CTX *)in_RSI);
  if (iVar3 != 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
            ,0x7d);
    fflush(_stderr);
    zmq_abort((char *)0x20cedd);
  }
  return 0;
}

Assistant:

int zmq::stream_t::xsend (msg_t *msg_)
{
    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        zmq_assert (!_current_out);

        //  If we have malformed message (prefix with no subsequent message)
        //  then just silently ignore it.
        //  TODO: The connections should be killed instead.
        if (msg_->flags () & msg_t::more) {
            //  Find the pipe associated with the routing id stored in the prefix.
            //  If there's no such pipe return an error

            out_pipe_t *out_pipe = lookup_out_pipe (
              blob_t (static_cast<unsigned char *> (msg_->data ()),
                      msg_->size (), reference_tag_t ()));

            if (out_pipe) {
                _current_out = out_pipe->pipe;
                if (!_current_out->check_write ()) {
                    out_pipe->active = false;
                    _current_out = NULL;
                    errno = EAGAIN;
                    return -1;
                }
            } else {
                errno = EHOSTUNREACH;
                return -1;
            }
        }

        //  Expect one more message frame.
        _more_out = true;

        int rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    //  Ignore the MORE flag
    msg_->reset_flags (msg_t::more);

    //  This is the last part of the message.
    _more_out = false;

    //  Push the message into the pipe. If there's no out pipe, just drop it.
    if (_current_out) {
        // Close the remote connection if user has asked to do so
        // by sending zero length message.
        // Pending messages in the pipe will be dropped (on receiving term- ack)
        if (msg_->size () == 0) {
            _current_out->terminate (false);
            int rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            _current_out = NULL;
            return 0;
        }
        const bool ok = _current_out->write (msg_);
        if (likely (ok))
            _current_out->flush ();
        _current_out = NULL;
    } else {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
    }

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}